

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infback.c
# Opt level: O2

int inflateBack(z_streamp strm,in_func in,void *in_desc,out_func out,void *out_desc)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  z_streamp pzVar4;
  uchar *puVar5;
  void *pvVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  undefined2 uVar13;
  uint uVar14;
  ushort *puVar15;
  uint uVar16;
  ulong uVar17;
  ulg uVar18;
  ulong uVar19;
  byte bVar20;
  ulong uVar21;
  Posf *pPVar22;
  uchar uVar23;
  uint uVar24;
  ulong uVar25;
  internal_state *piVar26;
  ulong uVar27;
  bool bVar28;
  uchar *next;
  z_streamp local_a8;
  void *local_a0;
  uint local_94;
  in_func local_90;
  uchar *local_88;
  ulong local_80;
  long *local_78;
  void *local_70;
  out_func local_68;
  ct_data_s *local_60;
  uInt *local_58;
  internal_state *local_50;
  Posf **local_48;
  ct_data_s *local_40;
  uint *local_38;
  
  if ((strm == (z_streamp)0x0) || (piVar26 = strm->state, piVar26 == (internal_state *)0x0)) {
    return -2;
  }
  strm->msg = (char *)0x0;
  *(undefined8 *)&piVar26->status = 0x3f3f;
  *(undefined4 *)&piVar26->gzindex = 0;
  next = strm->next_in;
  uVar7 = 0;
  if (next != (Bytef *)0x0) {
    uVar7 = strm->avail_in;
  }
  local_88 = *(uchar **)&piVar26->method;
  local_94 = *(uint *)((long)&piVar26->gzhead + 4);
  local_78 = &piVar26->block_start;
  local_40 = piVar26->dyn_ltree + 0x121;
  local_58 = &piVar26->hash_shift;
  local_48 = &piVar26->head;
  local_60 = piVar26->dyn_ltree + 0x91;
  local_38 = (uint *)((long)&piVar26->head + 4);
  iVar10 = 0x3f3f;
  uVar19 = 0;
  uVar27 = 0;
  local_a8 = strm;
  local_a0 = in_desc;
  local_90 = in;
  local_70 = out_desc;
  local_68 = out;
  local_50 = piVar26;
  do {
    pzVar4 = local_a8;
    uVar8 = (uint)uVar27;
    switch(iVar10) {
    case 0x3f3f:
      if (*(int *)&piVar26->field_0xc == 0) {
        while ((uint)uVar27 < 3) {
          if ((uVar7 == 0) && (uVar7 = (*local_90)(local_a0,&next), uVar7 == 0)) goto LAB_0010b490;
          uVar7 = uVar7 - 1;
          uVar19 = uVar19 + ((ulong)*next << ((byte)uVar27 & 0x3f));
          next = next + 1;
          uVar27 = (ulong)(uVar8 | 8);
        }
        *(uint *)&piVar26->field_0xc = (uint)uVar19 & 1;
        switch((uint)(uVar19 >> 1) & 3) {
        case 0:
          iVar10 = 0x3f41;
          break;
        case 1:
          piVar26->window_size = (ulg)fixedtables_lenfix;
          piVar26->head = (Posf *)0x500000009;
          piVar26->prev = (Posf *)fixedtables_distfix;
          iVar10 = 0x3f48;
          break;
        case 2:
          iVar10 = 0x3f44;
          break;
        case 3:
          local_a8->msg = "invalid block type";
          iVar10 = 0x3f51;
        }
        piVar26->status = iVar10;
        uVar19 = uVar19 >> 3;
        uVar27 = (ulong)((uint)uVar27 - 3);
        in_desc = local_a0;
      }
      else {
        uVar19 = uVar19 >> ((byte)uVar27 & 7);
        uVar27 = (ulong)(uVar8 & 0xfffffff8);
        piVar26->status = 0x3f50;
      }
      break;
    case 0x3f40:
    case 0x3f42:
    case 0x3f43:
    case 0x3f45:
    case 0x3f46:
    case 0x3f47:
      iVar10 = -2;
      local_a8 = pzVar4;
LAB_0010b4a1:
      local_a8->next_in = next;
      local_a8->avail_in = uVar7;
      return iVar10;
    case 0x3f41:
      uVar19 = uVar19 >> ((byte)uVar27 & 7);
      for (uVar27 = (ulong)(uVar8 & 0xfffffff8); pvVar6 = local_70, uVar27 < 0x20;
          uVar27 = uVar27 + 8) {
        if ((uVar7 == 0) && (uVar7 = (*local_90)(in_desc,&next), uVar7 == 0)) goto LAB_0010b490;
        uVar7 = uVar7 - 1;
        uVar19 = uVar19 + ((ulong)*next << ((byte)uVar27 & 0x3f));
        next = next + 1;
      }
      if ((uVar19 >> 0x10 ^ uVar19 & 0xffff) != 0xffff) {
        pcVar12 = "invalid stored block lengths";
        goto LAB_0010aa39;
      }
      uVar19 = uVar19 & 0xffff;
      while( true ) {
        uVar8 = (uint)uVar19;
        *(uint *)&piVar26->field_0x5c = uVar8;
        if (uVar8 == 0) break;
        if ((uVar7 == 0) && (uVar7 = (*local_90)(local_a0,&next), uVar7 == 0)) goto LAB_0010b490;
        uVar16 = local_94;
        if (local_94 == 0) {
          local_88 = *(uchar **)&piVar26->method;
          uVar16 = *(uint *)((long)&piVar26->gzhead + 4);
          *(uint *)&piVar26->gzindex = uVar16;
          iVar10 = (*local_68)(pvVar6,local_88,uVar16);
          if (iVar10 != 0) goto LAB_0010b499;
        }
        puVar5 = local_88;
        if (uVar7 <= uVar8) {
          uVar8 = uVar7;
        }
        if (uVar16 <= uVar8) {
          uVar8 = uVar16;
        }
        uVar19 = (ulong)uVar8;
        memcpy(local_88,next,uVar19);
        uVar7 = uVar7 - uVar8;
        next = next + uVar19;
        local_94 = uVar16 - uVar8;
        local_88 = puVar5 + uVar19;
        uVar19 = (ulong)(*(int *)&piVar26->field_0x5c - uVar8);
      }
      piVar26->status = 0x3f3f;
      uVar19 = 0;
      uVar27 = 0;
      in_desc = local_a0;
      break;
    case 0x3f44:
      for (uVar27 = uVar27 & 0xffffffff; uVar27 < 0xe; uVar27 = uVar27 + 8) {
        if ((uVar7 == 0) && (uVar7 = (*local_90)(in_desc,&next), uVar7 == 0)) goto LAB_0010b490;
        uVar7 = uVar7 - 1;
        uVar19 = uVar19 + ((ulong)*next << ((byte)uVar27 & 0x3f));
        next = next + 1;
      }
      uVar16 = (uint)uVar19 & 0x1f;
      piVar26->hash_size = uVar16 + 0x101;
      uVar9 = (uint)(uVar19 >> 5) & 0x1f;
      piVar26->hash_bits = uVar9 + 1;
      uVar8 = ((uint)(uVar19 >> 10) & 0xf) + 4;
      piVar26->ins_h = uVar8;
      uVar19 = uVar19 >> 0xe;
      uVar27 = uVar27 - 0xe;
      if (uVar16 < 0x1e && uVar9 < 0x1e) {
        piVar26->hash_mask = 0;
        uVar16 = 0;
        while (uVar16 < uVar8) {
          uVar8 = (uint)uVar27;
          while ((uint)uVar27 < 3) {
            if ((uVar7 == 0) && (uVar7 = (*local_90)(local_a0,&next), uVar7 == 0))
            goto LAB_0010b490;
            uVar7 = uVar7 - 1;
            uVar19 = uVar19 + ((ulong)*next << ((byte)uVar27 & 0x3f));
            next = next + 1;
            uVar27 = (ulong)(uVar8 | 8);
          }
          uVar8 = piVar26->hash_mask;
          uVar16 = uVar8 + 1;
          piVar26->hash_mask = uVar16;
          *(ushort *)((long)(piVar26->dyn_ltree + -0xf) + (ulong)inflateBack::order[uVar8] * 2) =
               (ushort)uVar19 & 7;
          uVar19 = uVar19 >> 3;
          uVar27 = (ulong)((uint)uVar27 - 3);
          in_desc = local_a0;
          uVar8 = piVar26->ins_h;
        }
        puVar15 = inflateBack::order + uVar16;
        while (uVar16 < 0x13) {
          uVar16 = uVar16 + 1;
          piVar26->hash_mask = uVar16;
          *(undefined2 *)((long)(piVar26->dyn_ltree + -0xf) + (ulong)*puVar15 * 2) = 0;
          puVar15 = puVar15 + 1;
        }
        *(ct_data_s **)&piVar26->hash_shift = local_40;
        piVar26->window_size = (ulg)local_40;
        *(undefined4 *)&piVar26->head = 7;
        iVar10 = inflate_table(CODES,(unsigned_short *)local_78,0x13,(code **)local_58,
                               (uint *)local_48,(unsigned_short *)local_60);
        if (iVar10 == 0) {
          piVar26->hash_mask = 0;
          uVar8 = 0;
          while (uVar8 < piVar26->hash_bits + piVar26->hash_size) {
            uVar25 = uVar27 & 0xffffffff;
            while( true ) {
              uVar17 = (ulong)(~(-1 << (*(byte *)&piVar26->head & 0x1f)) & (uint)uVar19);
              bVar1 = *(byte *)(piVar26->window_size + 1 + uVar17 * 4);
              uVar21 = (ulong)bVar1;
              if (uVar21 <= uVar25) break;
              if ((uVar7 == 0) && (uVar7 = (*local_90)(in_desc,&next), uVar7 == 0))
              goto LAB_0010b490;
              uVar7 = uVar7 - 1;
              uVar19 = uVar19 + ((ulong)*next << ((byte)uVar25 & 0x3f));
              uVar25 = uVar25 + 8;
              uVar27 = (ulong)((int)uVar27 + 8);
              next = next + 1;
            }
            uVar3 = *(ushort *)(piVar26->window_size + 2 + uVar17 * 4);
            if (uVar3 < 0x10) {
              uVar19 = uVar19 >> (bVar1 & 0x3f);
              uVar16 = piVar26->hash_mask;
              uVar8 = uVar16 + 1;
              piVar26->hash_mask = uVar8;
              *(ushort *)((long)(piVar26->dyn_ltree + -0xf) + (ulong)uVar16 * 2) = uVar3;
              uVar27 = (ulong)((int)uVar25 - (uint)bVar1);
            }
            else {
              local_80 = uVar21;
              if (uVar3 == 0x10) {
                uVar17 = uVar21 + 2;
                uVar8 = (int)uVar27 - (uint)bVar1;
                while( true ) {
                  uVar27 = (ulong)uVar8;
                  if (uVar17 <= uVar25) break;
                  if ((uVar7 == 0) &&
                     (uVar7 = (*local_90)(local_a0,&next), uVar21 = local_80, uVar7 == 0))
                  goto LAB_0010b490;
                  uVar7 = uVar7 - 1;
                  uVar19 = uVar19 + ((ulong)*next << ((byte)uVar25 & 0x3f));
                  uVar25 = uVar25 + 8;
                  uVar8 = uVar8 + 8;
                  next = next + 1;
                }
                uVar19 = uVar19 >> ((byte)uVar21 & 0x3f);
                if (piVar26->hash_mask == 0) {
                  local_a8->msg = "invalid bit length repeat";
                  goto LAB_0010af5d;
                }
                uVar13 = *(undefined2 *)((long)local_78 + (ulong)(piVar26->hash_mask - 1) * 2);
                iVar10 = ((uint)uVar19 & 3) + 3;
                uVar19 = uVar19 >> 2;
                uVar8 = ((int)uVar25 - (int)uVar21) - 2;
              }
              else {
                if (uVar3 == 0x11) {
                  uVar27 = uVar21 + 3;
                  for (; uVar25 < uVar27; uVar25 = uVar25 + 8) {
                    if ((uVar7 == 0) &&
                       (uVar7 = (*local_90)(local_a0,&next), uVar21 = local_80, uVar7 == 0))
                    goto LAB_0010b490;
                    uVar7 = uVar7 - 1;
                    uVar19 = uVar19 + ((ulong)*next << ((byte)uVar25 & 0x3f));
                    next = next + 1;
                  }
                  uVar19 = uVar19 >> ((byte)uVar21 & 0x3f);
                  iVar10 = ((uint)uVar19 & 7) + 3;
                  uVar19 = uVar19 >> 3;
                  uVar8 = ((int)uVar25 - (int)uVar21) - 3;
                }
                else {
                  uVar27 = uVar21 + 7;
                  for (; uVar25 < uVar27; uVar25 = uVar25 + 8) {
                    if ((uVar7 == 0) &&
                       (uVar7 = (*local_90)(local_a0,&next), uVar21 = local_80, uVar7 == 0))
                    goto LAB_0010b490;
                    uVar7 = uVar7 - 1;
                    uVar19 = uVar19 + ((ulong)*next << ((byte)uVar25 & 0x3f));
                    next = next + 1;
                  }
                  uVar19 = uVar19 >> ((byte)uVar21 & 0x3f);
                  iVar10 = ((uint)uVar19 & 0x7f) + 0xb;
                  uVar19 = uVar19 >> 7;
                  uVar8 = ((int)uVar25 - (int)uVar21) - 7;
                }
                uVar13 = 0;
              }
              uVar27 = (ulong)uVar8;
              uVar8 = piVar26->hash_mask;
              in_desc = local_a0;
              if (piVar26->hash_bits + piVar26->hash_size < uVar8 + iVar10) {
                pcVar12 = "invalid bit length repeat";
                goto LAB_0010aa39;
              }
              while (bVar28 = iVar10 != 0, iVar10 = iVar10 + -1, bVar28) {
                uVar25 = (ulong)uVar8;
                uVar8 = uVar8 + 1;
                *(undefined2 *)((long)local_78 + uVar25 * 2) = uVar13;
              }
              piVar26->hash_mask = uVar8;
            }
          }
          if (piVar26->status == 0x3f51) break;
          if (piVar26->dyn_ltree[0x71].fc.freq == 0) {
            pcVar12 = "invalid code -- missing end-of-block";
          }
          else {
            *(ct_data_s **)&piVar26->hash_shift = local_40;
            piVar26->window_size = (ulg)local_40;
            *(undefined4 *)&piVar26->head = 9;
            iVar10 = inflate_table(LENS,(unsigned_short *)local_78,piVar26->hash_size,
                                   (code **)local_58,(uint *)local_48,(unsigned_short *)local_60);
            pzVar4 = local_a8;
            if (iVar10 == 0) {
              piVar26->prev = *(Posf **)&piVar26->hash_shift;
              *(undefined4 *)((long)&piVar26->head + 4) = 6;
              iVar10 = inflate_table(DISTS,(unsigned_short *)
                                           ((long)local_78 + (ulong)piVar26->hash_size * 2),
                                     piVar26->hash_bits,(code **)local_58,local_38,
                                     (unsigned_short *)local_60);
              piVar26 = local_50;
              if (iVar10 == 0) {
                local_50->status = 0x3f48;
                in_desc = local_a0;
                goto switchD_0010a7f9_caseD_3f48;
              }
              pzVar4->msg = "invalid distances set";
LAB_0010af5d:
              piVar26->status = 0x3f51;
              in_desc = local_a0;
              break;
            }
            pcVar12 = "invalid literal/lengths set";
          }
        }
        else {
          pcVar12 = "invalid code lengths set";
        }
      }
      else {
        pcVar12 = "too many length or distance symbols";
      }
LAB_0010aa39:
      local_a8->msg = pcVar12;
      piVar26->status = 0x3f51;
      break;
    case 0x3f48:
switchD_0010a7f9_caseD_3f48:
      pzVar4 = local_a8;
      if ((5 < uVar7) && (0x101 < local_94)) {
        local_a8->next_out = local_88;
        local_a8->avail_out = local_94;
        local_a8->next_in = next;
        local_a8->avail_in = uVar7;
        piVar26->w_size = (int)uVar19;
        piVar26->w_bits = (int)(uVar19 >> 0x20);
        piVar26->w_mask = (uInt)uVar27;
        uVar7 = *(uint *)((long)&piVar26->gzhead + 4);
        if ((uint)piVar26->gzindex < uVar7) {
          *(uint *)&piVar26->gzindex = uVar7 - local_94;
        }
        inflate_fast(local_a8,uVar7);
        next = pzVar4->next_in;
        local_88 = pzVar4->next_out;
        local_94 = pzVar4->avail_out;
        uVar7 = pzVar4->avail_in;
        uVar19._0_4_ = piVar26->w_size;
        uVar19._4_4_ = piVar26->w_bits;
        uVar27 = (ulong)piVar26->w_mask;
        break;
      }
      uVar27 = uVar27 & 0xffffffff;
      while( true ) {
        uVar18 = piVar26->window_size;
        uVar25 = (ulong)(~(-1 << (*(byte *)&piVar26->head & 0x1f)) & (uint)uVar19);
        bVar1 = *(byte *)(uVar18 + 1 + uVar25 * 4);
        if (bVar1 <= uVar27) break;
        if ((uVar7 == 0) && (uVar7 = (*local_90)(in_desc,&next), uVar7 == 0)) goto LAB_0010b4bf;
        uVar7 = uVar7 - 1;
        uVar19 = uVar19 + ((ulong)*next << ((byte)uVar27 & 0x3f));
        uVar27 = uVar27 + 8;
        next = next + 1;
      }
      uVar3 = *(ushort *)(uVar18 + 2 + uVar25 * 4);
      bVar20 = *(byte *)(uVar18 + uVar25 * 4);
      bVar2 = bVar1;
      if ((byte)(bVar20 - 1) < 0xf) {
        while( true ) {
          uVar25 = (ulong)((((uint)uVar19 & ~(-1 << (bVar20 + bVar1 & 0x1f))) >> (bVar1 & 0x1f)) +
                          (uint)uVar3);
          bVar2 = *(byte *)(uVar18 + 1 + uVar25 * 4);
          if ((uint)bVar2 + (uint)bVar1 <= uVar27) break;
          if (uVar7 == 0) {
            uVar7 = (*local_90)(local_a0,&next);
            if (uVar7 == 0) goto LAB_0010b4bf;
            uVar18 = local_50->window_size;
            piVar26 = local_50;
          }
          uVar7 = uVar7 - 1;
          uVar19 = uVar19 + ((ulong)*next << ((byte)uVar27 & 0x3f));
          uVar27 = uVar27 + 8;
          next = next + 1;
        }
        uVar19 = uVar19 >> (bVar1 & 0x3f);
        uVar3 = *(ushort *)(uVar18 + 2 + uVar25 * 4);
        bVar20 = *(byte *)(uVar18 + uVar25 * 4);
        uVar27 = (ulong)((int)uVar27 - (uint)bVar1);
        in_desc = local_a0;
      }
      uVar23 = (uchar)uVar3;
      uVar19 = uVar19 >> (bVar2 & 0x3f);
      uVar27 = (ulong)((int)uVar27 - (uint)bVar2);
      *(uint *)&piVar26->field_0x5c = (uint)uVar3;
      if (bVar20 != 0) {
        if ((bVar20 & 0x20) == 0) {
          if ((bVar20 & 0x40) == 0) {
            uVar8 = bVar20 & 0xf;
            *(uint *)((long)&piVar26->window + 4) = uVar8;
            uVar25 = uVar27;
            if ((bVar20 & 0xf) != 0) {
              while( true ) {
                uVar16 = (uint)uVar25;
                uVar27 = (ulong)(uVar16 - uVar8);
                if (uVar8 <= uVar16) break;
                if (uVar7 == 0) {
                  uVar7 = (*local_90)(in_desc,&next);
                  if (uVar7 == 0) goto LAB_0010b490;
                  uVar8 = *(uint *)((long)&piVar26->window + 4);
                }
                uVar7 = uVar7 - 1;
                uVar19 = uVar19 + ((ulong)*next << ((byte)uVar25 & 0x3f));
                uVar25 = (ulong)(uVar16 + 8);
                next = next + 1;
              }
              *(uint *)&piVar26->field_0x5c =
                   *(int *)&piVar26->field_0x5c + (~(-1 << ((byte)uVar8 & 0x1f)) & (uint)uVar19);
              uVar19 = uVar19 >> ((byte)uVar8 & 0x3f);
            }
            while( true ) {
              pPVar22 = piVar26->prev;
              uVar25 = (ulong)(~(-1 << (*(byte *)((long)&piVar26->head + 4) & 0x1f)) & (uint)uVar19)
              ;
              bVar1 = *(byte *)((long)pPVar22 + uVar25 * 4 + 1);
              if (bVar1 <= uVar27) break;
              if ((uVar7 == 0) && (uVar7 = (*local_90)(in_desc,&next), uVar7 == 0))
              goto LAB_0010b4bf;
              uVar7 = uVar7 - 1;
              uVar19 = uVar19 + ((ulong)*next << ((byte)uVar27 & 0x3f));
              uVar27 = uVar27 + 8;
              next = next + 1;
            }
            uVar3 = pPVar22[uVar25 * 2 + 1];
            bVar20 = (byte)pPVar22[uVar25 * 2];
            bVar2 = bVar1;
            if (bVar20 < 0x10) {
              uVar8 = ~(-1 << (bVar20 + bVar1 & 0x1f));
              local_80 = CONCAT44(local_80._4_4_,uVar8);
              while( true ) {
                uVar25 = (ulong)((((uint)uVar19 & uVar8) >> (bVar1 & 0x1f)) + (uint)uVar3);
                bVar2 = *(byte *)((long)pPVar22 + uVar25 * 4 + 1);
                if ((uint)bVar2 + (uint)bVar1 <= uVar27) break;
                if (uVar7 == 0) {
                  uVar7 = (*local_90)(local_a0,&next);
                  if (uVar7 == 0) goto LAB_0010b4bf;
                  pPVar22 = piVar26->prev;
                  uVar8 = (uint)local_80;
                }
                uVar7 = uVar7 - 1;
                uVar19 = uVar19 + ((ulong)*next << ((byte)uVar27 & 0x3f));
                uVar27 = uVar27 + 8;
                next = next + 1;
              }
              uVar19 = uVar19 >> (bVar1 & 0x3f);
              uVar3 = pPVar22[uVar25 * 2 + 1];
              bVar20 = (byte)pPVar22[uVar25 * 2];
              uVar27 = (ulong)((int)uVar27 - (uint)bVar1);
              in_desc = local_a0;
            }
            uVar8 = (uint)uVar3;
            uVar16 = (int)uVar27 - (uint)bVar2;
            uVar27 = (ulong)uVar16;
            uVar19 = uVar19 >> (bVar2 & 0x3f);
            if ((bVar20 & 0x40) == 0) {
              *(uint *)&piVar26->window = uVar8;
              uVar9 = bVar20 & 0xf;
              *(uint *)((long)&piVar26->window + 4) = uVar9;
              if ((bVar20 & 0xf) != 0) {
                while( true ) {
                  uVar8 = (uint)uVar27;
                  uVar16 = uVar8 - uVar9;
                  if (uVar9 <= uVar8) break;
                  if (uVar7 == 0) {
                    uVar7 = (*local_90)(in_desc,&next);
                    if (uVar7 == 0) goto LAB_0010b4bf;
                    uVar9 = *(uint *)((long)&piVar26->window + 4);
                  }
                  uVar7 = uVar7 - 1;
                  uVar19 = uVar19 + ((ulong)*next << ((byte)uVar27 & 0x3f));
                  uVar27 = (ulong)(uVar8 + 8);
                  next = next + 1;
                }
                uVar8 = (~(-1 << ((byte)uVar9 & 0x1f)) & (uint)uVar19) + *(int *)&piVar26->window;
                *(uint *)&piVar26->window = uVar8;
                uVar19 = uVar19 >> ((byte)uVar9 & 0x3f);
              }
              uVar9 = *(uint *)((long)&piVar26->gzhead + 4);
              uVar14 = 0;
              if ((uint)piVar26->gzindex < uVar9) {
                uVar14 = local_94;
              }
              uVar24 = local_94;
              if (uVar9 - uVar14 < uVar8) {
                local_a8->msg = "invalid distance too far back";
                piVar26->status = 0x3f51;
              }
              else {
                do {
                  uVar8 = *(uint *)((long)&piVar26->gzhead + 4);
                  uVar9 = uVar8;
                  if (uVar24 == 0) {
                    local_88 = *(uchar **)&piVar26->method;
                    *(uint *)&piVar26->gzindex = uVar8;
                    iVar10 = (*local_68)(local_70,local_88,uVar8);
                    if (iVar10 != 0) goto LAB_0010b4c8;
                    uVar9 = *(uint *)((long)&piVar26->gzhead + 4);
                    uVar24 = uVar8;
                  }
                  uVar9 = uVar9 - *(uint *)&piVar26->window;
                  uVar27 = (ulong)uVar9;
                  bVar28 = uVar24 <= uVar9;
                  if (bVar28) {
                    uVar9 = 0;
                  }
                  uVar8 = *(uint *)&piVar26->field_0x5c;
                  if (bVar28) {
                    uVar27 = -(ulong)*(uint *)&piVar26->window;
                  }
                  uVar14 = uVar24 - uVar9;
                  if (uVar8 <= uVar24 - uVar9) {
                    uVar14 = uVar8;
                  }
                  *(uint *)&piVar26->field_0x5c = uVar8 - uVar14;
                  uVar8 = uVar14;
                  do {
                    *local_88 = local_88[uVar27];
                    local_88 = local_88 + 1;
                    uVar8 = uVar8 - 1;
                  } while (uVar8 != 0);
                  uVar24 = uVar24 - uVar14;
                } while (*(int *)&piVar26->field_0x5c != 0);
              }
              local_94 = uVar24;
              uVar27 = (ulong)uVar16;
              break;
            }
            pcVar12 = "invalid distance code";
          }
          else {
            pcVar12 = "invalid literal/length code";
          }
          goto LAB_0010aa39;
        }
        piVar26->status = 0x3f3f;
        break;
      }
      uVar8 = local_94;
      if (local_94 != 0) {
LAB_0010b1cc:
        *local_88 = uVar23;
        local_88 = local_88 + 1;
        local_94 = uVar8 - 1;
        piVar26->status = 0x3f48;
        break;
      }
      local_88 = *(uchar **)&piVar26->method;
      uVar8 = *(uint *)((long)&piVar26->gzhead + 4);
      *(uint *)&piVar26->gzindex = uVar8;
      iVar10 = (*local_68)();
      if (iVar10 == 0) {
        uVar23 = (uchar)*(undefined4 *)&piVar26->field_0x5c;
        goto LAB_0010b1cc;
      }
      goto LAB_0010b499;
    default:
      if (iVar10 == 0x3f50) {
        uVar8 = *(uint *)((long)&piVar26->gzhead + 4);
        uVar16 = uVar8 - local_94;
        if (uVar8 < local_94 || uVar16 == 0) {
          iVar10 = 1;
          local_a8 = pzVar4;
        }
        else {
          iVar11 = (*local_68)(local_70,*(uchar **)&piVar26->method,uVar16);
          local_a8 = pzVar4;
          iVar10 = -5;
          if (iVar11 == 0) {
            iVar10 = 1;
          }
        }
      }
      else if (iVar10 == 0x3f51) {
        iVar10 = -3;
        local_a8 = pzVar4;
      }
      else {
        iVar10 = -2;
        local_a8 = pzVar4;
      }
      goto LAB_0010b4a1;
    }
    iVar10 = piVar26->status;
  } while( true );
LAB_0010b4bf:
  next = (uchar *)0x0;
  uVar7 = 0;
LAB_0010b4c8:
  iVar10 = -5;
  goto LAB_0010b4a1;
LAB_0010b490:
  next = (uchar *)0x0;
  uVar7 = 0;
LAB_0010b499:
  iVar10 = -5;
  goto LAB_0010b4a1;
}

Assistant:

int ZEXPORT inflateBack(strm, in, in_desc, out, out_desc)
z_streamp strm;
in_func in;
void FAR *in_desc;
out_func out;
void FAR *out_desc;
{
    struct inflate_state FAR *state;
    z_const unsigned char FAR *next;    /* next input */
    unsigned char FAR *put;     /* next output */
    unsigned have, left;        /* available input and output */
    unsigned long hold;         /* bit buffer */
    unsigned bits;              /* bits in bit buffer */
    unsigned copy;              /* number of stored or match bytes to copy */
    unsigned char FAR *from;    /* where to copy match bytes from */
    code here;                  /* current decoding table entry */
    code last;                  /* parent table entry */
    unsigned len;               /* length to copy for repeats, bits to drop */
    int ret;                    /* return code */
    static const unsigned short order[19] = /* permutation of code lengths */
        {16, 17, 18, 0, 8, 7, 9, 6, 10, 5, 11, 4, 12, 3, 13, 2, 14, 1, 15};

    /* Check that the strm exists and that the state was initialized */
    if (strm == Z_NULL || strm->state == Z_NULL)
        return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;

    /* Reset the state */
    strm->msg = Z_NULL;
    state->mode = TYPE;
    state->last = 0;
    state->whave = 0;
    next = strm->next_in;
    have = next != Z_NULL ? strm->avail_in : 0;
    hold = 0;
    bits = 0;
    put = state->window;
    left = state->wsize;

    /* Inflate until end of block marked as last */
    for (;;)
        switch (state->mode) {
        case TYPE:
            /* determine and dispatch block type */
            if (state->last) {
                BYTEBITS();
                state->mode = DONE;
                break;
            }
            NEEDBITS(3);
            state->last = BITS(1);
            DROPBITS(1);
            switch (BITS(2)) {
            case 0:                             /* stored block */
                Tracev((stderr, "inflate:     stored block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = STORED;
                break;
            case 1:                             /* fixed block */
                fixedtables(state);
                Tracev((stderr, "inflate:     fixed codes block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = LEN;              /* decode codes */
                break;
            case 2:                             /* dynamic block */
                Tracev((stderr, "inflate:     dynamic codes block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = TABLE;
                break;
            case 3:
                strm->msg = (char *)"invalid block type";
                state->mode = BAD;
            }
            DROPBITS(2);
            break;

        case STORED:
            /* get and verify stored block length */
            BYTEBITS();                         /* go to byte boundary */
            NEEDBITS(32);
            if ((hold & 0xffff) != ((hold >> 16) ^ 0xffff)) {
                strm->msg = (char *)"invalid stored block lengths";
                state->mode = BAD;
                break;
            }
            state->length = (unsigned)hold & 0xffff;
            Tracev((stderr, "inflate:       stored length %u\n",
                    state->length));
            INITBITS();

            /* copy stored block from input to output */
            while (state->length != 0) {
                copy = state->length;
                PULL();
                ROOM();
                if (copy > have) copy = have;
                if (copy > left) copy = left;
                zmemcpy(put, next, copy);
                have -= copy;
                next += copy;
                left -= copy;
                put += copy;
                state->length -= copy;
            }
            Tracev((stderr, "inflate:       stored end\n"));
            state->mode = TYPE;
            break;

        case TABLE:
            /* get dynamic table entries descriptor */
            NEEDBITS(14);
            state->nlen = BITS(5) + 257;
            DROPBITS(5);
            state->ndist = BITS(5) + 1;
            DROPBITS(5);
            state->ncode = BITS(4) + 4;
            DROPBITS(4);
#ifndef PKZIP_BUG_WORKAROUND
            if (state->nlen > 286 || state->ndist > 30) {
                strm->msg = (char *)"too many length or distance symbols";
                state->mode = BAD;
                break;
            }
#endif
            Tracev((stderr, "inflate:       table sizes ok\n"));

            /* get code length code lengths (not a typo) */
            state->have = 0;
            while (state->have < state->ncode) {
                NEEDBITS(3);
                state->lens[order[state->have++]] = (unsigned short)BITS(3);
                DROPBITS(3);
            }
            while (state->have < 19)
                state->lens[order[state->have++]] = 0;
            state->next = state->codes;
            state->lencode = (code const FAR *)(state->next);
            state->lenbits = 7;
            ret = inflate_table(CODES, state->lens, 19, &(state->next),
                                &(state->lenbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid code lengths set";
                state->mode = BAD;
                break;
            }
            Tracev((stderr, "inflate:       code lengths ok\n"));

            /* get length and distance code code lengths */
            state->have = 0;
            while (state->have < state->nlen + state->ndist) {
                for (;;) {
                    here = state->lencode[BITS(state->lenbits)];
                    if ((unsigned)(here.bits) <= bits) break;
                    PULLBYTE();
                }
                if (here.val < 16) {
                    DROPBITS(here.bits);
                    state->lens[state->have++] = here.val;
                }
                else {
                    if (here.val == 16) {
                        NEEDBITS(here.bits + 2);
                        DROPBITS(here.bits);
                        if (state->have == 0) {
                            strm->msg = (char *)"invalid bit length repeat";
                            state->mode = BAD;
                            break;
                        }
                        len = (unsigned)(state->lens[state->have - 1]);
                        copy = 3 + BITS(2);
                        DROPBITS(2);
                    }
                    else if (here.val == 17) {
                        NEEDBITS(here.bits + 3);
                        DROPBITS(here.bits);
                        len = 0;
                        copy = 3 + BITS(3);
                        DROPBITS(3);
                    }
                    else {
                        NEEDBITS(here.bits + 7);
                        DROPBITS(here.bits);
                        len = 0;
                        copy = 11 + BITS(7);
                        DROPBITS(7);
                    }
                    if (state->have + copy > state->nlen + state->ndist) {
                        strm->msg = (char *)"invalid bit length repeat";
                        state->mode = BAD;
                        break;
                    }
                    while (copy--)
                        state->lens[state->have++] = (unsigned short)len;
                }
            }

            /* handle error breaks in while */
            if (state->mode == BAD) break;

            /* check for end-of-block code (better have one) */
            if (state->lens[256] == 0) {
                strm->msg = (char *)"invalid code -- missing end-of-block";
                state->mode = BAD;
                break;
            }

            /* build code tables -- note: do not change the lenbits or distbits
               values here (9 and 6) without reading the comments in inftrees.h
               concerning the ENOUGH constants, which depend on those values */
            state->next = state->codes;
            state->lencode = (code const FAR *)(state->next);
            state->lenbits = 9;
            ret = inflate_table(LENS, state->lens, state->nlen, &(state->next),
                                &(state->lenbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid literal/lengths set";
                state->mode = BAD;
                break;
            }
            state->distcode = (code const FAR *)(state->next);
            state->distbits = 6;
            ret = inflate_table(DISTS, state->lens + state->nlen, state->ndist,
                            &(state->next), &(state->distbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid distances set";
                state->mode = BAD;
                break;
            }
            Tracev((stderr, "inflate:       codes ok\n"));
            state->mode = LEN;

        case LEN:
            /* use inflate_fast() if we have enough input and output */
            if (have >= 6 && left >= 258) {
                RESTORE();
                if (state->whave < state->wsize)
                    state->whave = state->wsize - left;
                inflate_fast(strm, state->wsize);
                LOAD();
                break;
            }

            /* get a literal, length, or end-of-block code */
            for (;;) {
                here = state->lencode[BITS(state->lenbits)];
                if ((unsigned)(here.bits) <= bits) break;
                PULLBYTE();
            }
            if (here.op && (here.op & 0xf0) == 0) {
                last = here;
                for (;;) {
                    here = state->lencode[last.val +
                            (BITS(last.bits + last.op) >> last.bits)];
                    if ((unsigned)(last.bits + here.bits) <= bits) break;
                    PULLBYTE();
                }
                DROPBITS(last.bits);
            }
            DROPBITS(here.bits);
            state->length = (unsigned)here.val;

            /* process literal */
            if (here.op == 0) {
                Tracevv((stderr, here.val >= 0x20 && here.val < 0x7f ?
                        "inflate:         literal '%c'\n" :
                        "inflate:         literal 0x%02x\n", here.val));
                ROOM();
                *put++ = (unsigned char)(state->length);
                left--;
                state->mode = LEN;
                break;
            }

            /* process end of block */
            if (here.op & 32) {
                Tracevv((stderr, "inflate:         end of block\n"));
                state->mode = TYPE;
                break;
            }

            /* invalid code */
            if (here.op & 64) {
                strm->msg = (char *)"invalid literal/length code";
                state->mode = BAD;
                break;
            }

            /* length code -- get extra bits, if any */
            state->extra = (unsigned)(here.op) & 15;
            if (state->extra != 0) {
                NEEDBITS(state->extra);
                state->length += BITS(state->extra);
                DROPBITS(state->extra);
            }
            Tracevv((stderr, "inflate:         length %u\n", state->length));

            /* get distance code */
            for (;;) {
                here = state->distcode[BITS(state->distbits)];
                if ((unsigned)(here.bits) <= bits) break;
                PULLBYTE();
            }
            if ((here.op & 0xf0) == 0) {
                last = here;
                for (;;) {
                    here = state->distcode[last.val +
                            (BITS(last.bits + last.op) >> last.bits)];
                    if ((unsigned)(last.bits + here.bits) <= bits) break;
                    PULLBYTE();
                }
                DROPBITS(last.bits);
            }
            DROPBITS(here.bits);
            if (here.op & 64) {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
            state->offset = (unsigned)here.val;

            /* get distance extra bits, if any */
            state->extra = (unsigned)(here.op) & 15;
            if (state->extra != 0) {
                NEEDBITS(state->extra);
                state->offset += BITS(state->extra);
                DROPBITS(state->extra);
            }
            if (state->offset > state->wsize - (state->whave < state->wsize ?
                                                left : 0)) {
                strm->msg = (char *)"invalid distance too far back";
                state->mode = BAD;
                break;
            }
            Tracevv((stderr, "inflate:         distance %u\n", state->offset));

            /* copy match from window to output */
            do {
                ROOM();
                copy = state->wsize - state->offset;
                if (copy < left) {
                    from = put + copy;
                    copy = left - copy;
                }
                else {
                    from = put - state->offset;
                    copy = left;
                }
                if (copy > state->length) copy = state->length;
                state->length -= copy;
                left -= copy;
                do {
                    *put++ = *from++;
                } while (--copy);
            } while (state->length != 0);
            break;

        case DONE:
            /* inflate stream terminated properly -- write leftover output */
            ret = Z_STREAM_END;
            if (left < state->wsize) {
                if (out(out_desc, state->window, state->wsize - left))
                    ret = Z_BUF_ERROR;
            }
            goto inf_leave;

        case BAD:
            ret = Z_DATA_ERROR;
            goto inf_leave;

        default:                /* can't happen, but makes compilers happy */
            ret = Z_STREAM_ERROR;
            goto inf_leave;
        }

    /* Return unused input */
  inf_leave:
    strm->next_in = next;
    strm->avail_in = have;
    return ret;
}